

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O2

png_fixed_point png_reciprocal(png_fixed_point a)

{
  int iVar1;
  double dVar2;
  
  dVar2 = floor(10000000000.0 / (double)a + 0.5);
  iVar1 = (int)dVar2;
  if (dVar2 < -2147483648.0) {
    iVar1 = 0;
  }
  if (2147483647.0 < dVar2) {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

png_fixed_point
png_reciprocal(png_fixed_point a)
{
#ifdef PNG_FLOATING_ARITHMETIC_SUPPORTED
   double r = floor(1E10/a+.5);

   if (r <= 2147483647. && r >= -2147483648.)
      return (png_fixed_point)r;
#else
   png_fixed_point res;

   if (png_muldiv(&res, 100000, 100000, a) != 0)
      return res;
#endif

   return 0; /* error/overflow */
}